

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

void * __thiscall
QtPrivate::QVariantTypeCoercer::convert(QVariantTypeCoercer *this,QVariant *value,QMetaType *type)

{
  long lVar1;
  bool bVar2;
  QMetaTypeInterface *in_RDX;
  void *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *unaff_retaddr;
  QMetaType in_stack_00000038;
  QVariant *in_stack_ffffffffffffff98;
  QMetaType *in_stack_ffffffffffffffa0;
  QMetaTypeInterface *lhs;
  QMetaType targetType;
  void *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDX;
  QMetaType::fromType<QVariant>();
  bVar2 = ::operator==(in_stack_ffffffffffffffa0,(QMetaType *)in_stack_ffffffffffffff98);
  local_30 = in_RSI;
  if (!bVar2) {
    targetType.d_ptr = lhs;
    ::QVariant::metaType(in_stack_ffffffffffffff98);
    bVar2 = ::operator==((QMetaType *)lhs,(QMetaType *)in_stack_ffffffffffffff98);
    if (bVar2) {
      local_30 = ::QVariant::constData((QVariant *)0x43950f);
    }
    else {
      bVar2 = ::QVariant::canConvert(in_RDI,targetType);
      if (bVar2) {
        ::QVariant::operator=((QVariant *)in_RDX,in_RDI);
        bVar2 = ::QVariant::convert(unaff_retaddr,in_stack_00000038);
        if (bVar2) {
          local_30 = ::QVariant::constData((QVariant *)0x439573);
          goto LAB_00439585;
        }
      }
      local_30 = (void *)0x0;
    }
  }
LAB_00439585:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

const void *QtPrivate::QVariantTypeCoercer::convert(const QVariant &value, const QMetaType &type)
{
    if (type == QMetaType::fromType<QVariant>())
        return &value;

    if (type == value.metaType())
        return value.constData();

    if (value.canConvert(type)) {
        converted = value;
        if (converted.convert(type))
            return converted.constData();
    }

    return nullptr;
}